

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O1

hash_code __thiscall
llvm::hashing::detail::hash_combine_recursive_helper::combine<short,llvm::hash_code>
          (hash_combine_recursive_helper *this,size_t length,char *buffer_ptr,char *buffer_end,
          short *arg,hash_code *args)

{
  char *pcVar1;
  hash_code hVar2;
  size_t local_30;
  size_t local_28;
  
  local_30 = length;
  pcVar1 = combine_data<short>(this,&local_30,buffer_ptr,buffer_end,*arg);
  local_28 = local_30;
  pcVar1 = combine_data<unsigned_long>(this,&local_28,pcVar1,buffer_end,args->value);
  hVar2 = combine(this,local_28,pcVar1,buffer_end);
  return (hash_code)hVar2.value;
}

Assistant:

hash_code combine(size_t length, char *buffer_ptr, char *buffer_end,
                    const T &arg, const Ts &...args) {
    buffer_ptr = combine_data(length, buffer_ptr, buffer_end, get_hashable_data(arg));

    // Recurse to the next argument.
    return combine(length, buffer_ptr, buffer_end, args...);
  }